

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void add_high_resist(artifact *art,artifact_set_data *data)

{
  short *psVar1;
  uint32_t uVar2;
  _Bool local_2d;
  int local_2c;
  uint32_t uStack_28;
  _Bool success;
  wchar_t count;
  wchar_t temp;
  wchar_t r;
  size_t i;
  artifact_set_data *data_local;
  artifact *art_local;
  
  local_2c = 0;
  local_2d = false;
  uStack_28 = 0;
  for (_temp = 0; _temp < 0xd; _temp = _temp + 1) {
    uStack_28 = data->art_probs[art_idx_high_resist[_temp]] + uStack_28;
  }
  for (; local_2d == false && local_2c < 200; local_2c = local_2c + 1) {
    uVar2 = Rand_div(uStack_28);
    uStack_28 = data->art_probs[art_idx_high_resist[0]];
    _temp = 0;
    for (; (int)uStack_28 < (int)(uVar2 + 1) && _temp < 0xd;
        uStack_28 = data->art_probs[*psVar1] + uStack_28) {
      psVar1 = art_idx_high_resist + _temp;
      _temp = _temp + 1;
    }
    if (_temp == 0) {
      local_2d = add_resist(art,L'\x04');
    }
    else if (_temp == 1) {
      local_2d = add_flag(art,L'\x06');
    }
    else if (_temp == 2) {
      local_2d = add_resist(art,L'\x05');
    }
    else if (_temp == 3) {
      local_2d = add_resist(art,L'\x06');
    }
    else if (_temp == 4) {
      local_2d = add_flag(art,L'\a');
    }
    else if (_temp == 5) {
      local_2d = add_flag(art,L'\b');
    }
    else if (_temp == 6) {
      local_2d = add_resist(art,L'\a');
    }
    else if (_temp == 7) {
      local_2d = add_resist(art,L'\b');
    }
    else if (_temp == 8) {
      local_2d = add_resist(art,L'\t');
    }
    else if (_temp == 9) {
      local_2d = add_resist(art,L'\n');
    }
    else if (_temp == 10) {
      local_2d = add_resist(art,L'\v');
    }
    else if (_temp == 0xb) {
      local_2d = add_resist(art,L'\f');
    }
    else if (_temp == 0xc) {
      local_2d = add_flag(art,L'\t');
    }
  }
  return;
}

Assistant:

static void add_high_resist(struct artifact *art,
							struct artifact_set_data *data)
{
	/* Add a high resist, according to the generated frequency distribution. */
	size_t i;
	int r, temp;
	int count = 0;
	bool success = false;

	temp = 0;
	for (i = 0; i < N_ELEMENTS(art_idx_high_resist); i++)
		temp += data->art_probs[art_idx_high_resist[i]];

	/* The following will fail (cleanly) if all high resists already added */
	while (!success && (count < MAX_TRIES)) {
		/* Randomize from 1 to this total amount */
		r = randint1(temp);

		/* Determine which (weighted) resist this number corresponds to */

		temp = data->art_probs[art_idx_high_resist[0]];
		i = 0;
		while (r > temp && i < N_ELEMENTS(art_idx_high_resist))	{
			temp += data->art_probs[art_idx_high_resist[i]];
			i++;
		}

		/* Now i should give us the index of the correct high resist */
		if (i == 0) success = add_resist(art, ELEM_POIS);
		else if (i == 1) success = add_flag(art, OF_PROT_FEAR);
		else if (i == 2) success = add_resist(art, ELEM_LIGHT);
		else if (i == 3) success = add_resist(art, ELEM_DARK);
		else if (i == 4) success = add_flag(art, OF_PROT_BLIND);
		else if (i == 5) success = add_flag(art, OF_PROT_CONF);
		else if (i == 6) success = add_resist(art, ELEM_SOUND);
		else if (i == 7) success = add_resist(art, ELEM_SHARD);
		else if (i == 8) success = add_resist(art, ELEM_NEXUS);
		else if (i == 9) success = add_resist(art, ELEM_NETHER);
		else if (i == 10) success = add_resist(art, ELEM_CHAOS);
		else if (i == 11) success = add_resist(art, ELEM_DISEN);
		else if (i == 12) success = add_flag(art, OF_PROT_STUN);

		count++;
	}
}